

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gbabus.c
# Opt level: O3

void gba_write_byte(uint32_t addr,uint8_t value,access_type_t access_type)

{
  ushort uVar1;
  bool bVar2;
  uint16_t uVar3;
  byte bVar4;
  uint uVar5;
  gbabus_t **ppgVar6;
  gbabus_t *pgVar7;
  ushort uVar8;
  uint uVar9;
  uint value_00;
  int *piVar10;
  ulong uVar11;
  ushort uVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  gba_ppu_t *pgVar17;
  char *pcVar18;
  uint32_t mirrored;
  
  uVar16 = (ulong)addr;
  if (access_type == ACCESS_NONSEQUENTIAL) {
    piVar10 = nonsequential_byte_half_cycles;
LAB_00112622:
    cpu->this_step_ticks = cpu->this_step_ticks + piVar10[addr >> 0x18];
  }
  else if (access_type == ACCESS_SEQUENTIAL) {
    piVar10 = sequential_byte_half_cycles;
    goto LAB_00112622;
  }
  pgVar7 = bus;
  pgVar17 = ppu;
  switch((ulong)(addr >> 0x18)) {
  case 0:
    if (gba_log_verbosity != 0) {
      pcVar18 = "\x1b[0;33m[WARN]  Tried to write to the BIOS!\n\x1b[0;m";
LAB_001128f6:
      printf(pcVar18);
      return;
    }
    break;
  case 2:
    mem->ewram[addr & 0x3ffff] = value;
    break;
  case 3:
    mem->iwram[addr & 0x7fff] = value;
    break;
  case 4:
    if (0x40003ff < addr) {
      return;
    }
    if ((io_register_access[addr + 0xfc000000] & ~R) != W) {
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar18 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable byte ioreg 0x%08X\n\x1b[0;m";
      goto LAB_001126a0;
    }
    if (io_register_sizes[addr + 0xfc000000] == '\x04') {
      bVar4 = (char)addr * '\b';
      value_00 = (uint)value << (bVar4 & 0x1f);
      uVar9 = 0xff << (bVar4 & 0x1f);
      uVar5 = addr & 0xffc;
      if ((uVar5 < 0x3d) && ((0x1100110000000000U >> ((ulong)uVar5 & 0x3f) & 1) != 0)) {
        if ((uVar5 - 0x28 < 0x18) && (uVar5 = uVar5 - 0x28 >> 2, (0x33U >> (uVar5 & 0x1f) & 1) != 0)
           ) {
          lVar15 = *(long *)(&DAT_00127218 + (ulong)uVar5 * 8);
          if (ppu->y == 0xe3 || ppu->y < 0xa1) {
            *(uint *)((long)(ppu->screen + -1) + 0x3be + *(long *)(&DAT_00127248 + (ulong)uVar5 * 8)
                     ) = *(uint *)((long)(ppu->screen + -1) + 0x3be +
                                  *(long *)(&DAT_00127248 + (ulong)uVar5 * 8)) & ~uVar9 |
                         value_00 & uVar9;
          }
          *(uint *)((long)(pgVar17->screen + -1) + 0x3be + lVar15) =
               ~uVar9 & *(uint *)((long)(pgVar17->screen + -1) + 0x3be + lVar15) | value_00 & uVar9;
          return;
        }
        goto LAB_001134b8;
      }
      if (uVar5 == 0xa4) {
        iVar13 = 1;
LAB_00112b1f:
        write_fifo(apu,iVar13,value_00,uVar9);
        return;
      }
      if (uVar5 == 0xa0) {
        iVar13 = 0;
        goto LAB_00112b1f;
      }
      uVar16 = (ulong)(addr & 0x7fffffc);
      uVar14 = (addr & 0x7fffffc) + 0xfc000000;
      if ((io_register_access[uVar14] & ~R) != W) {
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar18 = "\x1b[0;33m[WARN]  Ignoring write to unwriteable word ioreg 0x%08X\n\x1b[0;m";
        goto LAB_001126a0;
      }
      if (io_register_sizes[uVar14] == '\x04') {
        if (uVar5 < 0xbc) {
          if (uVar5 < 0xa0) {
            ppgVar6 = (gbabus_t **)&ppu;
            if (uVar5 < 0x38) {
              lVar15 = 0x3ecac;
              if (uVar5 != 0x28) {
                if (uVar5 != 0x2c) goto LAB_001134da;
                lVar15 = 0x3ecb4;
              }
            }
            else if (uVar5 == 0x38) {
              lVar15 = 0x3ecbc;
            }
            else {
              if (uVar5 != 0x3c) goto LAB_001134da;
              lVar15 = 0x3ecc4;
            }
            goto LAB_001133a8;
          }
          if (uVar5 < 0xb0) {
            if ((uVar5 != 0xa0) && (uVar5 != 0xa4)) goto LAB_001134da;
            goto LAB_00112edf;
          }
          if (uVar5 == 0xb0) {
            lVar15 = 0x10;
          }
          else {
            if (uVar5 != 0xb4) goto LAB_001134da;
            lVar15 = 0x14;
          }
        }
        else if (uVar5 < 0xd4) {
          if (uVar5 < 200) {
            if (uVar5 == 0xbc) {
              lVar15 = 0x30;
            }
            else {
              if (uVar5 != 0xc0) goto LAB_001134da;
              lVar15 = 0x34;
            }
          }
          else if (uVar5 == 200) {
            lVar15 = 0x50;
          }
          else {
            if (uVar5 != 0xcc) goto LAB_001134da;
            lVar15 = 0x54;
          }
        }
        else {
          if (0x14f < uVar5) {
            if (((uVar5 != 0x150) && (uVar5 != 0x154)) && (uVar5 != 0x800)) goto LAB_001134da;
LAB_00112edf:
            if (gba_log_verbosity == 0) {
              return;
            }
            pcVar18 = 
            "\x1b[0;33m[WARN]  Ignoring write to word ioreg 0x%08X with mask 0x%08X\n\x1b[0;m";
            uVar11 = (ulong)uVar9;
LAB_001128db:
            printf(pcVar18,uVar16,uVar11);
            return;
          }
          if (uVar5 == 0xd4) {
            lVar15 = 0x70;
          }
          else {
            if (uVar5 != 0xd8) goto LAB_001134da;
            lVar15 = 0x74;
          }
        }
        ppgVar6 = &bus;
LAB_001133a8:
        uVar5 = *(uint *)((long)(((gba_ppu_t *)*ppgVar6)->screen + -1) + 0x3be + lVar15);
        *(uint *)((long)(((gba_ppu_t *)*ppgVar6)->screen + -1) + 0x3be + lVar15) =
             (value_00 ^ uVar5) & uVar9 ^ uVar5;
        return;
      }
      goto LAB_001134ce;
    }
    if (io_register_sizes[addr + 0xfc000000] != '\x02') {
      if ((addr & 0xfff) == 0x300) {
        if (gba_log_verbosity == 0) {
          return;
        }
        pcVar18 = "\x1b[0;33m[WARN]  Ignoring write to POSTFLG register\n\x1b[0;m";
        goto LAB_001128f6;
      }
      if ((addr & 0xfff) != 0x301) goto LAB_001134bd;
      if ((value & 1) == 0) {
        if (gba_log_verbosity != 0) {
          printf("\x1b[0;33m[WARN]  HALTING CPU!\n\x1b[0;m");
        }
        cpu->halt = true;
        return;
      }
      goto LAB_001134c9;
    }
    bVar4 = (char)addr * '\b' & 8;
    uVar1 = (ushort)value << bVar4;
    uVar9 = addr & 0xffe;
    uVar8 = (ushort)(0xff << bVar4);
    if (0x7f < uVar9) {
      if (uVar9 < 0x100) {
        if (uVar9 < 0x9c) {
          if (uVar9 < 0x92) {
            switch(uVar9) {
            case 0x80:
            case 0x82:
            case 0x84:
switchD_00112b04_caseD_80:
              if (gba_log_verbosity == 0) {
                return;
              }
              pcVar18 = "\x1b[0;33m[WARN]  Ignoring access to sound register: 0x%03X\n\x1b[0;m";
              goto LAB_00112f52;
            case 0x86:
              break;
            case 0x88:
              lVar15 = 0x96;
              goto LAB_00112da2;
            default:
              if (uVar9 == 0x90) goto switchD_00112b04_caseD_80;
            }
          }
          else if (uVar9 < 0x96) {
            if ((uVar9 == 0x92) || (uVar9 == 0x94)) goto switchD_00112b04_caseD_80;
          }
          else if ((uVar9 == 0x96) || ((uVar9 == 0x98 || (uVar9 == 0x9a))))
          goto switchD_00112b04_caseD_80;
        }
        else if (uVar9 < 0xc6) {
          if (0xb7 < uVar9) {
            if (uVar9 == 0xb8) {
              lVar15 = 0x18;
            }
            else {
              if (uVar9 == 0xba) {
                uVar3 = (uVar1 ^ (bus->DMA0CNT_H).raw) & uVar8 ^ (bus->DMA0CNT_H).raw;
                (bus->DMA0CNT_H).raw = uVar3;
                goto LAB_00112c1f;
              }
              if (uVar9 != 0xc4) goto switchD_00112c4f_caseD_206;
              lVar15 = 0x38;
            }
LAB_00112ffd:
            uVar12 = *(ushort *)((long)&bus->interrupt_master_enable + lVar15);
            *(ushort *)((long)&bus->interrupt_master_enable + lVar15) =
                 (uVar1 ^ uVar12) & uVar8 ^ uVar12;
LAB_00113015:
            gba_dma();
            return;
          }
          if ((uVar9 == 0x9c) || (uVar9 == 0x9e)) goto switchD_00112b04_caseD_80;
        }
        else if (uVar9 < 0xd2) {
          if (uVar9 == 0xc6) {
            uVar3 = (uVar1 ^ (bus->DMA1CNT_H).raw) & uVar8 ^ (bus->DMA1CNT_H).raw;
            (bus->DMA1CNT_H).raw = uVar3;
LAB_00112e54:
            if (-1 < (short)uVar3) {
              (pgVar7->DMA1INT).previously_enabled = false;
            }
            goto LAB_00113015;
          }
          if (uVar9 == 0xd0) {
            lVar15 = 0x58;
            goto LAB_00112ffd;
          }
        }
        else {
          if (uVar9 == 0xd2) {
            uVar3 = (uVar1 ^ (bus->DMA2CNT_H).raw) & uVar8 ^ (bus->DMA2CNT_H).raw;
            (bus->DMA2CNT_H).raw = uVar3;
            goto LAB_00112f99;
          }
          if (uVar9 == 0xdc) {
            lVar15 = 0x78;
            goto LAB_00112ffd;
          }
          if (uVar9 == 0xde) {
            uVar3 = (uVar1 ^ (bus->DMA3CNT_H).raw) & uVar8 ^ (bus->DMA3CNT_H).raw;
            (bus->DMA3CNT_H).raw = uVar3;
            goto LAB_00112fdd;
          }
        }
      }
      else {
        if (uVar9 < 0x140) {
          switch(uVar9) {
          case 0x120:
          case 0x122:
          case 0x124:
          case 0x126:
          case 0x128:
          case 0x12a:
switchD_00112c79_caseD_120:
            if (gba_log_verbosity == 0) {
              return;
            }
            pcVar18 = "\x1b[0;33m[WARN]  Ignoring access to SIO register: 0x%03X\n\x1b[0;m";
LAB_00112f52:
            printf(pcVar18,(ulong)uVar9);
            goto LAB_00112f5c;
          case 300:
          case 0x12e:
            goto switchD_00112c4f_caseD_206;
          case 0x130:
            lVar15 = 8;
            break;
          case 0x132:
            lVar15 = 0x94;
            break;
          case 0x134:
            lVar15 = 0x90;
            break;
          default:
            switch(uVar9) {
            case 0x100:
              lVar15 = 0xa2;
              break;
            case 0x102:
              uVar12 = bus->TMCNT_H[0].raw;
              bus->TMCNT_H[0].raw = (uVar1 ^ uVar12) & uVar8 ^ uVar12;
LAB_00113339:
              iVar13 = 0;
              goto LAB_00113366;
            case 0x104:
              lVar15 = 0xa4;
              break;
            case 0x106:
              uVar12 = bus->TMCNT_H[1].raw;
              bus->TMCNT_H[1].raw = (uVar1 ^ uVar12) & uVar8 ^ uVar12;
LAB_001132df:
              iVar13 = 1;
              goto LAB_00113366;
            case 0x108:
              lVar15 = 0xa6;
              break;
            case 0x10a:
              uVar12 = bus->TMCNT_H[2].raw;
              bus->TMCNT_H[2].raw = (uVar1 ^ uVar12) & uVar8 ^ uVar12;
              goto LAB_0011335e;
            case 0x10c:
              lVar15 = 0xa8;
              break;
            case 0x10e:
              uVar12 = bus->TMCNT_H[3].raw;
              bus->TMCNT_H[3].raw = (uVar1 ^ uVar12) & uVar8 ^ uVar12;
LAB_00113307:
              iVar13 = 3;
              goto LAB_00113366;
            default:
              goto switchD_00112c4f_caseD_206;
            }
          }
LAB_00112da2:
          ppgVar6 = &bus;
          goto LAB_00112da9;
        }
        if (uVar9 < 0x158) {
          if (uVar9 == 0x140) {
            lVar15 = 0x92;
            goto LAB_00112da2;
          }
          if ((uVar9 == 0x150) || (uVar9 == 0x154)) goto switchD_00112c79_caseD_120;
        }
        else {
          switch(uVar9) {
          case 0x200:
            lVar15 = 4;
            goto LAB_00112da2;
          case 0x202:
            goto switchD_00112c4f_caseD_202;
          case 0x204:
            (bus->WAITCNT).raw = (uVar1 ^ (bus->WAITCNT).raw) & uVar8 ^ (bus->WAITCNT).raw;
            goto LAB_00112eb9;
          case 0x206:
            break;
          case 0x208:
            ppgVar6 = &bus;
            goto LAB_00113060;
          default:
            if (uVar9 == 0x158) goto switchD_00112c79_caseD_120;
          }
        }
      }
      goto switchD_00112c4f_caseD_206;
    }
    if (0x5f < uVar9) {
      if (uVar9 < 0x70) {
        if (uVar9 < 100) {
          if ((uVar9 == 0x60) || (uVar9 == 0x62)) goto switchD_00112b04_caseD_80;
        }
        else if ((uVar9 == 100) || ((uVar9 == 0x68 || (uVar9 == 0x6c))))
        goto switchD_00112b04_caseD_80;
      }
      else if (uVar9 < 0x74) {
        if ((uVar9 == 0x70) || (uVar9 == 0x72)) goto switchD_00112b04_caseD_80;
      }
      else if ((uVar9 == 0x74) || ((uVar9 == 0x78 || (uVar9 == 0x7c))))
      goto switchD_00112b04_caseD_80;
      goto switchD_00112c4f_caseD_206;
    }
    ppgVar6 = (gbabus_t **)&ppu;
    switch(uVar9) {
    case 0:
      lVar15 = 0x3ec34;
      break;
    case 2:
      if (gba_log_verbosity == 0) {
        return;
      }
      printf("\x1b[0;33m[WARN]  Ignoring access to Green Swap register\n\x1b[0;m");
      goto LAB_00112f5c;
    case 4:
      pgVar17 = (gba_ppu_t *)&ppu->DISPSTAT;
      uVar8 = uVar8 & 0xfff8;
      goto LAB_0011324e;
    case 6:
      ppgVar6 = (gbabus_t **)&ppu;
LAB_00113060:
      pgVar17 = (gba_ppu_t *)*ppgVar6;
      if (pgVar17 != (gba_ppu_t *)0x0) {
        if (uVar9 == 0x208) {
          uVar8 = 1;
LAB_0011324e:
          ((DISPSTAT_t *)&pgVar17->y)->raw =
               (uVar1 ^ ((DISPSTAT_t *)&pgVar17->y)->raw) & uVar8 ^ ((DISPSTAT_t *)&pgVar17->y)->raw
          ;
          return;
        }
        if (uVar9 == 0x202) {
switchD_00112c4f_caseD_202:
          (bus->IF).raw = (bus->IF).raw & ~uVar1;
          return;
        }
        uVar12 = ((DISPSTAT_t *)&pgVar17->y)->raw;
        ((DISPSTAT_t *)&pgVar17->y)->raw = (uVar1 ^ uVar12) & uVar8 ^ uVar12;
        pgVar7 = bus;
        if (uVar9 < 0xdc) {
          if (uVar9 < 0xc6) {
            if (uVar9 == 0xb8) goto LAB_00113015;
            if (uVar9 != 0xba) {
              if (uVar9 != 0xc4) {
                return;
              }
              goto LAB_00113015;
            }
            uVar3 = (bus->DMA0CNT_H).raw;
LAB_00112c1f:
            if (-1 < (short)uVar3) {
              (pgVar7->DMA0INT).previously_enabled = false;
            }
            goto LAB_00113015;
          }
          if (uVar9 == 0xc6) {
            uVar3 = (bus->DMA1CNT_H).raw;
            goto LAB_00112e54;
          }
          if (uVar9 == 0xd0) goto LAB_00113015;
          if (uVar9 != 0xd2) {
            return;
          }
          uVar3 = (bus->DMA2CNT_H).raw;
LAB_00112f99:
          if (-1 < (short)uVar3) {
            (pgVar7->DMA2INT).previously_enabled = false;
          }
          goto LAB_00113015;
        }
        if (uVar9 < 0x106) {
          if (uVar9 == 0xdc) goto LAB_00113015;
          if (uVar9 == 0xde) {
            uVar3 = (bus->DMA3CNT_H).raw;
LAB_00112fdd:
            if (-1 < (short)uVar3) {
              (pgVar7->DMA3INT).previously_enabled = false;
            }
            goto LAB_00113015;
          }
          if (uVar9 != 0x102) {
            return;
          }
          goto LAB_00113339;
        }
        if (0x10d < uVar9) {
          if (uVar9 != 0x10e) {
            if (uVar9 != 0x204) {
              return;
            }
LAB_00112eb9:
            on_waitcnt_updated();
            return;
          }
          goto LAB_00113307;
        }
        if (uVar9 == 0x106) goto LAB_001132df;
        if (uVar9 != 0x10a) {
          return;
        }
LAB_0011335e:
        iVar13 = 2;
LAB_00113366:
        tmcnth_write(iVar13,uVar12);
        return;
      }
LAB_00112f5c:
      if (gba_log_verbosity == 0) {
        return;
      }
      pcVar18 = "\x1b[0;33m[WARN]  Ignoring write to half ioreg 0x%08X\n\x1b[0;m";
      uVar16 = (ulong)(addr & 0x7fffffe);
LAB_001126a0:
      printf(pcVar18,uVar16);
      return;
    case 8:
      lVar15 = 0x3ec38;
      break;
    case 10:
      lVar15 = 0x3ec3c;
      break;
    case 0xc:
      lVar15 = 0x3ec40;
      break;
    case 0xe:
      lVar15 = 0x3ec44;
      break;
    case 0x10:
      lVar15 = 0x3ec48;
      break;
    case 0x12:
      lVar15 = 0x3ec4c;
      break;
    case 0x14:
      lVar15 = 0x3ec50;
      break;
    case 0x16:
      lVar15 = 0x3ec54;
      break;
    case 0x18:
      lVar15 = 0x3ec58;
      break;
    case 0x1a:
      lVar15 = 0x3ec5c;
      break;
    case 0x1c:
      lVar15 = 0x3ec60;
      break;
    case 0x1e:
      lVar15 = 0x3ec64;
      break;
    case 0x20:
      lVar15 = 0x3ec68;
      break;
    case 0x22:
      lVar15 = 0x3ec6c;
      break;
    case 0x24:
      lVar15 = 0x3ec70;
      break;
    case 0x26:
      lVar15 = 0x3ec74;
      break;
    default:
      goto switchD_00112c4f_caseD_206;
    case 0x30:
      lVar15 = 0x3ec78;
      break;
    case 0x32:
      lVar15 = 0x3ec7c;
      break;
    case 0x34:
      lVar15 = 0x3ec80;
      break;
    case 0x36:
      lVar15 = 0x3ec84;
      break;
    case 0x40:
      lVar15 = 0x3ec88;
      break;
    case 0x42:
      lVar15 = 0x3ec8c;
      break;
    case 0x44:
      lVar15 = 0x3ec90;
      break;
    case 0x46:
      lVar15 = 0x3ec94;
      break;
    case 0x48:
      lVar15 = 0x3ec98;
      break;
    case 0x4a:
      lVar15 = 0x3ec9a;
      break;
    case 0x4c:
      lVar15 = 0x3ec9c;
      break;
    case 0x50:
      lVar15 = 0x3eca0;
      break;
    case 0x52:
      lVar15 = 0x3eca4;
      break;
    case 0x54:
      lVar15 = 0x3eca8;
    }
LAB_00112da9:
    uVar12 = *(ushort *)((long)(((gba_ppu_t *)*ppgVar6)->screen + -1) + 0x3be + lVar15);
    *(ushort *)((long)(((gba_ppu_t *)*ppgVar6)->screen + -1) + 0x3be + lVar15) =
         (uVar1 ^ uVar12) & uVar8 ^ uVar12;
    break;
  case 5:
    ppu->pram[addr & 0x3fe] = value;
    ppu->pram[(ulong)(addr & 0x3fe) + 1] = value;
    break;
  case 6:
    bVar2 = (addr & 0xffff0000) == 0x6000000;
    if ((ushort)(((ppu->DISPCNT).raw & 7) - 3) < 3) {
      bVar2 = addr + 0xfa000000 < 0x14000;
    }
    if (bVar2) {
      uVar9 = (addr + 0xfa000000) % 0x18000;
      ppu->vram[uVar9 & 0x1fffe] = value;
      ppu->vram[(ulong)uVar9 | 1] = value;
    }
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
    if ((bus->backup_type != EEPROM) || ((addr < 0xdffff00 && (0x1000000 < mem->rom_size)))) {
      if (gba_log_verbosity < 3) {
        return;
      }
      pcVar18 = "[DEBUG] Ignoring write to cartridge space address 0x%08X\n";
      goto LAB_001126a0;
    }
    gba_write_byte_cold_1();
switchD_001126d0_default:
    gba_write_byte_cold_2();
LAB_001134b8:
    gba_write_byte_cold_3();
LAB_001134bd:
    gba_write_byte_cold_8();
LAB_001134c9:
    gba_write_byte_cold_7();
LAB_001134ce:
    gba_write_byte_cold_4();
switchD_00112c4f_caseD_206:
    gba_write_byte_cold_6();
LAB_001134da:
    gba_write_byte_cold_5();
  case 0xe:
  case 0xf:
    switch(bus->backup_type) {
    case UNKNOWN:
      if (gba_log_verbosity != 0) {
        pcVar18 = "\x1b[0;33m[WARN]  Tried to access backup when backup type unknown!\n\x1b[0;m";
        goto LAB_001128f6;
      }
      break;
    case SRAM:
      mem->backup[addr & 0x7fff] = value;
      mem->backup_dirty = true;
      break;
    case EEPROM:
      if (gba_log_verbosity == 0) {
        return;
      }
      uVar11 = (ulong)value;
      pcVar18 = "\x1b[0;33m[WARN]  Ignoring byte write to EEPROM: [0x%08X]=0x%02X\n\x1b[0;m";
      goto LAB_001128db;
    case FLASH64K:
    case FLASH128K:
      write_byte_flash(mem,bus,addr,value);
      return;
    default:
      goto switchD_001126d0_default;
    }
  }
  return;
}

Assistant:

void gba_write_byte(word addr, byte value, access_type_t access_type) {
    addr &= ~(sizeof(byte) - 1);
    half region = addr >> 24;
    tick_memory_waitstate(access_type, sizeof(byte), region);
    switch (region) {
        case REGION_BIOS: {
            logwarn("Tried to write to the BIOS!")
            break;
        }
        case REGION_EWRAM: {
            word index = (addr - 0x02000000) % 0x40000;
            mem->ewram[index] = value;
            break;
        }
        case REGION_IWRAM: {
            word index = (addr - 0x03000000) % 0x8000;
            mem->iwram[index] = value;
            break;
        }
        case REGION_IOREG: {
            if (addr < 0x04000400) {
                write_byte_ioreg(addr, value);
            }
#ifdef ENABLE_MGBA_DEBUG
            else {
                if (addr == 0x4FFF700 || addr == 0x4FFF780 || (addr >= 0x4FFF600 && addr < 0x4FFF700)) {
                    mgba_debug_write_byte(addr, value);
                } else {
                    logwarn("Write 0x%02X to 0x%08X\n", value, addr)
                }
            }
#endif
            break;
        }
        case REGION_PRAM: {
            word index = (addr - 0x5000000) % 0x400;
            word lower_index = index & 0xFFFFFFFE;
            word upper_index = lower_index + 1;
            ppu->pram[lower_index] = value;
            ppu->pram[upper_index] = value;
            break;
        }
        case REGION_VRAM: {
            word index = addr - 0x06000000;
            index %= VRAM_SIZE;
            // Special case for single byte writes to VRAM, OBJ writes are ignored.
            if (is_bg(addr)) {
                word lower_index = index & 0xFFFFFFFE;
                word upper_index = lower_index + 1;
                ppu->vram[lower_index] = value;
                ppu->vram[upper_index] = value;
            }
            break;
        }
        case REGION_OAM: {
            break; // 8 bit writes to OAM are ignored
        }
        case REGION_GAMEPAK0_L:
        case REGION_GAMEPAK0_H:
        case REGION_GAMEPAK1_L:
        case REGION_GAMEPAK1_H:
        case REGION_GAMEPAK2_L:
        case REGION_GAMEPAK2_H: {
            if (bus->backup_type == EEPROM) {
                if (mem->rom_size <= 0x1000000 || addr >= 0xDFFFF00) {
                    logfatal("Write byte 0x%02X to EEPROM at addr 0x%08X", value, addr)
                }
            }
            logdebug("Ignoring write to cartridge space address 0x%08X", addr)
            break;
        }
        case REGION_SRAM:
        case REGION_SRAM_MIRR:
            // Backup space
            switch (bus->backup_type) {
                case SRAM:
                    mem->backup[addr & 0x7FFF] = value;
                    mem->backup_dirty = true;
                    break;
                case UNKNOWN:
                    logwarn("Tried to access backup when backup type unknown!")
                    break;
                case EEPROM:
                    logwarn("Ignoring byte write to EEPROM: [0x%08X]=0x%02X", addr, value)
                    break;
                case FLASH64K:
                case FLASH128K:
                    write_byte_flash(mem, bus, addr, value);
                    break;
                default:
                    logfatal("Unknown backup type index %d!", bus->backup_type)
            }
            break;
        default:
            return;
    }
}